

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_deviation(lysp_yin_ctx *ctx,lysp_deviation **deviations)

{
  lysp_ext_instance **pplVar1;
  lysp_ext_instance *plVar2;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  lysp_deviation *plVar6;
  yin_subelement subelems [4];
  lysf_ctx local_b8;
  yin_subelement local_98;
  undefined4 local_80;
  long *local_78;
  undefined2 local_70;
  undefined4 local_68;
  long *local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  local_b8.mod = (lys_module *)0x0;
  local_b8.ext_set.size = 0;
  local_b8.ext_set.count = 0;
  local_b8.ext_set.field_2.dnodes = (lyd_node **)0x0;
  if (ctx == (lysp_yin_ctx *)0x0) {
    local_b8.ctx = (ly_ctx *)0x0;
  }
  else {
    local_b8.ctx = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  plVar6 = *deviations;
  if (plVar6 == (lysp_deviation *)0x0) {
    plVar4 = (long *)malloc(0x30);
    if (plVar4 == (long *)0x0) goto LAB_001848ec;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    plVar2 = plVar6[-1].exts;
    plVar6[-1].exts = (lysp_ext_instance *)((long)&plVar2->name + 1);
    plVar4 = (long *)realloc(&plVar6[-1].exts,(long)plVar2 * 0x28 + 0x30);
    if (plVar4 == (long *)0x0) {
      (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
LAB_001848ec:
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_deviation");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *deviations = (lysp_deviation *)(plVar4 + 1);
  plVar6 = (lysp_deviation *)(plVar4 + lVar5 * 5 + -4);
  plVar6->ref = (char *)0x0;
  plVar6->deviates = (lysp_deviate *)0x0;
  plVar6->nodeid = (char *)0x0;
  plVar6->dsc = (char *)0x0;
  plVar6->exts = (lysp_ext_instance *)0x0;
  LVar3 = lyxml_ctx_next(ctx->xmlctx);
  if ((LVar3 == LY_SUCCESS) &&
     (LVar3 = yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,(char **)plVar6,Y_STR_ARG,
                                  LY_STMT_DEVIATION), LVar3 == LY_SUCCESS)) {
    if (*plVar6->nodeid == '\0') {
      ly_log((ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
             LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.","deviation");
    }
    local_98.type = LY_STMT_DESCRIPTION;
    local_98.dest = plVar4 + lVar5 * 5 + -3;
    local_98.flags = 2;
    local_80 = 0x90000;
    local_78 = plVar4 + lVar5 * 5 + -1;
    local_70 = 1;
    local_68 = 0x270000;
    local_60 = plVar4 + lVar5 * 5 + -2;
    local_58 = 2;
    uStack_48 = 0;
    local_40 = 0;
    local_50 = 0xf0000;
    LVar3 = yin_parse_content(ctx,&local_98,4,plVar6,LY_STMT_DEVIATION,(char **)0x0,
                              (lysp_ext_instance **)(plVar4 + lVar5 * 5));
    if (LVar3 == LY_SUCCESS) {
      plVar2 = (lysp_ext_instance *)plVar4[lVar5 * 5];
      if (plVar2 == (lysp_ext_instance *)0x0) {
        return LY_SUCCESS;
      }
      LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,plVar2,'\x01',(uint32_t *)0x0);
      if (LVar3 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
    }
  }
  lysp_deviation_free(&local_b8,plVar6);
  plVar6 = *deviations;
  pplVar1 = &plVar6[-1].exts;
  *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)[-1].exts + 7);
  if (*pplVar1 == (lysp_ext_instance *)0x0) {
    free(&plVar6[-1].exts);
    *deviations = (lysp_deviation *)0x0;
  }
  return LVar3;
}

Assistant:

static LY_ERR
yin_parse_deviation(struct lysp_yin_ctx *ctx, struct lysp_deviation **deviations)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_deviation *dev = NULL;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(ctx)};

    /* create new deviation */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *deviations, dev, LY_EMEM);

    /* parse argument */
    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    LY_CHECK_GOTO(ret = yin_parse_attribute(ctx, YIN_ARG_TARGET_NODE, &dev->nodeid, Y_STR_ARG, LY_STMT_DEVIATION), cleanup);
    CHECK_NONEMPTY((struct lysp_ctx *)ctx, strlen(dev->nodeid), "deviation");
    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &dev->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_DEVIATE, &dev->deviates, YIN_SUBELEM_MANDATORY},
        {LY_STMT_REFERENCE, &dev->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), dev, LY_STMT_DEVIATION, NULL, &dev->exts);
    LY_CHECK_GOTO(ret, cleanup);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_GOTO(ret = yin_unres_exts_add(ctx, dev->exts), cleanup);

cleanup:
    if (ret) {
        lysp_deviation_free(&fctx, dev);
        LY_ARRAY_DECREMENT_FREE(*deviations);
    }
    return ret;
}